

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

void __thiscall kratos::Const::set_value(Const *this,string *new_value)

{
  size_type sVar1;
  VarException *this_00;
  byte bVar2;
  ulong uVar3;
  initializer_list<const_kratos::IRNode_*> __l;
  Const *local_70;
  string local_68;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_48;
  allocator_type local_29;
  
  sVar1 = new_value->_M_string_length;
  if (8 < sVar1 * 8) {
    this_00 = (VarException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"string value too big to be converted to integer","");
    __l._M_len = 1;
    __l._M_array = (iterator)&local_70;
    local_70 = this;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_48,__l,&local_29);
    VarException::VarException(this_00,&local_68,&local_48);
    __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (sVar1 == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    bVar2 = 0;
    do {
      uVar3 = uVar3 | (long)(new_value->_M_dataplus)._M_p[sVar1 - 1] << (bVar2 & 0x3f);
      bVar2 = bVar2 + 8;
      sVar1 = sVar1 - 1;
    } while (sVar1 != 0);
  }
  (*(this->super_Var).super_IRNode._vptr_IRNode[0x2b])(this,uVar3);
  return;
}

Assistant:

void Const::set_value(const std::string &new_value) {
    // convert string to int
    if ((new_value.size() * 8) > sizeof(uint64_t)) {
        throw VarException("string value too big to be converted to integer", {this});
    }
    auto converted_value = convert_string_to_int(new_value);
    set_value(converted_value);
}